

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O3

void jsonrpccxx::check_param_type<unsigned_int>
               (size_t index,json *x,value_t expectedType,type *param_4)

{
  value_t vVar1;
  undefined8 in_RAX;
  ulong uVar2;
  JsonRpcException *pJVar3;
  long *plVar4;
  size_type *psVar5;
  byte bVar6;
  value_t t;
  value_t t_00;
  undefined7 in_register_00000011;
  ulong uVar7;
  byte bVar9;
  pointer pcVar10;
  longlong ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_t local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  string local_48;
  ulong uVar8;
  
  uVar7 = CONCAT71(in_register_00000011,expectedType);
  vVar1 = x->m_type;
  uVar2 = CONCAT71((int7)((ulong)in_RAX >> 8),vVar1);
  bVar9 = (byte)(uVar7 & 0xffffffff);
  local_a0 = index;
  if ((int)uVar7 == 6) {
    uVar8 = uVar7;
    if (vVar1 == number_integer) {
      local_c0._M_dataplus._M_p = (pointer)0x0;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long_long,_0>
                (x,(longlong *)&local_c0);
      if (-1 < (long)local_c0._M_dataplus._M_p) {
        return;
      }
      pJVar3 = (JsonRpcException *)__cxa_allocate_exception(0x60);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unsigned integer","");
      std::operator+(&local_78,"invalid parameter: must be ",&local_98);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_e0._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_e0._M_dataplus._M_p == psVar5) {
        local_e0.field_2._M_allocated_capacity = *psVar5;
        local_e0.field_2._8_8_ = plVar4[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar5;
      }
      local_e0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      type_name_abi_cxx11_
                (&local_48,(jsonrpccxx *)(ulong)x->m_type,(value_t)local_e0._M_string_length);
      std::operator+(&local_c0,&local_e0,&local_48);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_58,&local_a0);
      JsonRpcException::JsonRpcException(pJVar3,-0x7f5a,&local_c0,&local_58);
      __cxa_throw(pJVar3,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
    }
  }
  else {
    param_4 = (type *)(uVar2 & 0xffffffff ^ 6);
    bVar6 = bVar9 ^ 5 | (byte)param_4;
    uVar8 = CONCAT71((int7)((uVar7 & 0xffffffff) >> 8),bVar6);
    if (bVar6 == 0) {
      local_c0._M_dataplus._M_p = (pointer)0x0;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long_long,_0>
                (x,(unsigned_long_long *)&local_c0);
      if (local_c0._M_dataplus._M_p._4_4_ == 0) {
        return;
      }
      pJVar3 = (JsonRpcException *)__cxa_allocate_exception(0x60);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      local_e0._M_string_length = 7;
      local_e0.field_2._M_allocated_capacity = 0x72656765746e69;
      std::operator+(&local_c0,"invalid parameter: exceeds value range of ",&local_e0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<unsigned_long_&,_unsigned_long,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_78,&local_a0);
      JsonRpcException::JsonRpcException(pJVar3,-0x7f5a,&local_c0,(json *)&local_78);
      __cxa_throw(pJVar3,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
    }
    if (vVar1 == number_unsigned) {
      uVar2 = 6;
      if (bVar9 == 7) {
LAB_00148891:
        local_c0._M_dataplus._M_p = (pointer)0x0;
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                  (x,(double *)&local_c0);
        pcVar10 = (pointer)(long)local_c0._M_dataplus._M_p;
        local_c0._M_dataplus._M_p = (pointer)0x0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long_long,_0>
                  (x,(longlong *)&local_c0);
        if (local_c0._M_dataplus._M_p == pcVar10) {
          return;
        }
        pJVar3 = (JsonRpcException *)__cxa_allocate_exception(0x60);
        type_name_abi_cxx11_(&local_e0,(jsonrpccxx *)(ulong)expectedType,t_00);
        std::operator+(&local_c0,"invalid parameter: exceeds value range of ",&local_e0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json<unsigned_long_&,_unsigned_long,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_78,&local_a0);
        JsonRpcException::JsonRpcException(pJVar3,-0x7f5a,&local_c0,(json *)&local_78);
        __cxa_throw(pJVar3,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
      }
    }
    else {
      param_4 = (type *)(uVar2 & 0xffffffff ^ 5);
      bVar6 = (byte)(uVar7 & 0xffffffff) ^ 7 | (byte)param_4;
      uVar8 = CONCAT71((int7)((uVar7 & 0xffffffff) >> 8),bVar6);
      if (bVar6 == 0) goto LAB_00148891;
    }
  }
  if ((byte)uVar2 == bVar9) {
    return;
  }
  pJVar3 = (JsonRpcException *)__cxa_allocate_exception(0x60,x,uVar8,param_4);
  type_name_abi_cxx11_(&local_98,(jsonrpccxx *)(ulong)expectedType,t);
  std::operator+(&local_78,"invalid parameter: must be ",&local_98);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_e0._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_e0._M_dataplus._M_p == psVar5) {
    local_e0.field_2._M_allocated_capacity = *psVar5;
    local_e0.field_2._8_8_ = plVar4[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar5;
  }
  local_e0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  type_name_abi_cxx11_(&local_48,(jsonrpccxx *)(ulong)x->m_type,(value_t)local_e0._M_string_length);
  std::operator+(&local_c0,&local_e0,&local_48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_58,&local_a0);
  JsonRpcException::JsonRpcException(pJVar3,-0x7f5a,&local_c0,&local_58);
  __cxa_throw(pJVar3,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
}

Assistant:

inline void check_param_type(size_t index, const json &x, json::value_t expectedType, typename std::enable_if<std::is_arithmetic<T>::value>::type * = 0) {
    if (expectedType == json::value_t::number_unsigned && x.type() == json::value_t::number_integer) {
      if (x.get<long long int>() < 0)
        throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    } else if (x.type() == json::value_t::number_unsigned && expectedType == json::value_t::number_integer) {
      if (x.get<long long unsigned>() > (long long unsigned)std::numeric_limits<T>::max()) {
        throw JsonRpcException(invalid_params, "invalid parameter: exceeds value range of " + type_name(expectedType), index);
      }
    }
    else if ((x.type() == json::value_t::number_unsigned || x.type() == json::value_t::number_integer) && expectedType == json::value_t::number_float) {
      if (static_cast<long long int>(x.get<double>()) != x.get<long long int>()) {
        throw JsonRpcException(invalid_params, "invalid parameter: exceeds value range of " + type_name(expectedType), index);
      }
    } else if (x.type() != expectedType) {
      throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    }
  }